

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_encode_memory
               (uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGColorType colortype,
               uint bitdepth)

{
  undefined1 local_228 [8];
  LodePNGState state;
  uint error;
  LodePNGColorType colortype_local;
  uint h_local;
  uint w_local;
  uchar *image_local;
  size_t *outsize_local;
  uchar **out_local;
  
  state._500_4_ = colortype;
  lodepng_state_init((LodePNGState *)local_228);
  state.encoder.text_compression = state._500_4_;
  state.encoder._84_4_ = bitdepth;
  state.info_png.interlace_method = state._500_4_;
  state.info_png._12_4_ = bitdepth;
  lodepng_encode(out,outsize,image,w,h,(LodePNGState *)local_228);
  state.error = (uint)state.info_png.unknown_chunks_size[2];
  lodepng_state_cleanup((LodePNGState *)local_228);
  return state.error;
}

Assistant:

unsigned lodepng_encode_memory(unsigned char** out, size_t* outsize, const unsigned char* image,
                               unsigned w, unsigned h, LodePNGColorType colortype, unsigned bitdepth) {
  unsigned error;
  LodePNGState state;
  lodepng_state_init(&state);
  state.info_raw.colortype = colortype;
  state.info_raw.bitdepth = bitdepth;
  state.info_png.color.colortype = colortype;
  state.info_png.color.bitdepth = bitdepth;
  lodepng_encode(out, outsize, image, w, h, &state);
  error = state.error;
  lodepng_state_cleanup(&state);
  return error;
}